

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindLargest(MergingIterator *this)

{
  IteratorWrapper *pIVar1;
  bool bVar2;
  int iVar3;
  IteratorWrapper *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  IteratorWrapper *child;
  int i;
  IteratorWrapper *largest;
  IteratorWrapper *in_stack_ffffffffffffffa8;
  int local_3c;
  IteratorWrapper *local_38;
  Slice local_28;
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (IteratorWrapper *)0x0;
  local_3c = *(int *)(in_RDI + 0x38);
  pIVar1 = local_38;
  while (local_38 = pIVar1, local_3c = local_3c + -1, -1 < local_3c) {
    this_00 = (IteratorWrapper *)(*(long *)(in_RDI + 0x30) + (long)local_3c * 0x20);
    bVar2 = IteratorWrapper::Valid(in_stack_ffffffffffffffa8);
    pIVar1 = local_38;
    if ((bVar2) && (pIVar1 = this_00, local_38 != (IteratorWrapper *)0x0)) {
      in_stack_ffffffffffffffa8 = *(IteratorWrapper **)(in_RDI + 0x28);
      local_18 = IteratorWrapper::key(this_00);
      local_28 = IteratorWrapper::key(this_00);
      iVar3 = (*(code *)(in_stack_ffffffffffffffa8->iter_->cleanup_head_).arg1)
                        (in_stack_ffffffffffffffa8,&local_18,&local_28);
      pIVar1 = local_38;
      if (0 < iVar3) {
        pIVar1 = this_00;
      }
    }
  }
  *(IteratorWrapper **)(in_RDI + 0x40) = local_38;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MergingIterator::FindLargest() {
  IteratorWrapper* largest = nullptr;
  for (int i = n_ - 1; i >= 0; i--) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (largest == nullptr) {
        largest = child;
      } else if (comparator_->Compare(child->key(), largest->key()) > 0) {
        largest = child;
      }
    }
  }
  current_ = largest;
}